

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuilderTask.cpp
# Opt level: O2

ExecutionResult __thiscall
nigel::BuilderTask::execute
          (BuilderTask *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          *parameters,set<char,_std::less<char>,_std::allocator<char>_> *flags)

{
  _Rb_tree_header *p_Var1;
  double __x;
  bool bVar2;
  ExecutionResult EVar3;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  startTime;
  iterator iVar4;
  _List_node_base *p_Var5;
  allocator local_151;
  list<std::shared_ptr<nigel::CompileNotification>,_std::allocator<std::shared_ptr<nigel::CompileNotification>_>_>
  notificationList;
  shared_ptr<nigel::BuilderExecutable> e;
  _List_base<std::shared_ptr<nigel::CompileNotification>,_std::allocator<std::shared_ptr<nigel::CompileNotification>_>_>
  local_110;
  CodeBase codeBase;
  
  codeBase.lexerStruct.
  super__List_base<std::shared_ptr<nigel::Token>,_std::allocator<std::shared_ptr<nigel::Token>_>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&codeBase.lexerStruct;
  codeBase.destFile.super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  codeBase.destFile.super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  codeBase.srcFile.super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  codeBase.srcFile.super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  codeBase.memModel = large;
  codeBase._36_8_ = 0;
  codeBase.fileCont.
  super__Vector_base<nigel::CodeBase::LineContent,_std::allocator<nigel::CodeBase::LineContent>_>.
  _M_impl.super__Vector_impl_data._M_start._4_4_ = 0;
  codeBase.fileCont.
  super__Vector_base<nigel::CodeBase::LineContent,_std::allocator<nigel::CodeBase::LineContent>_>.
  _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
  codeBase.fileCont.
  super__Vector_base<nigel::CodeBase::LineContent,_std::allocator<nigel::CodeBase::LineContent>_>.
  _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
  codeBase.fileCont.
  super__Vector_base<nigel::CodeBase::LineContent,_std::allocator<nigel::CodeBase::LineContent>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  codeBase.imCommands.
  super__List_base<std::shared_ptr<nigel::IM_Command>,_std::allocator<std::shared_ptr<nigel::IM_Command>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&codeBase.imCommands;
  codeBase.lexerStruct.
  super__List_base<std::shared_ptr<nigel::Token>,_std::allocator<std::shared_ptr<nigel::Token>_>_>.
  _M_impl._M_node._M_size = 0;
  codeBase.globalAst.super___shared_ptr<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  codeBase.globalAst.super___shared_ptr<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  codeBase.imCommands.
  super__List_base<std::shared_ptr<nigel::IM_Command>,_std::allocator<std::shared_ptr<nigel::IM_Command>_>_>
  ._M_impl._M_node._M_size = 0;
  codeBase.imValues._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &codeBase.imValues._M_t._M_impl.super__Rb_tree_header._M_header;
  codeBase.imValues._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  codeBase.imValues._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  codeBase.imValues._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  codeBase.hexBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  codeBase.hexBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  codeBase.hexBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  codeBase.lexerStruct.
  super__List_base<std::shared_ptr<nigel::Token>,_std::allocator<std::shared_ptr<nigel::Token>_>_>.
  _M_impl._M_node.super__List_node_base._M_prev =
       codeBase.lexerStruct.
       super__List_base<std::shared_ptr<nigel::Token>,_std::allocator<std::shared_ptr<nigel::Token>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  codeBase.imCommands.
  super__List_base<std::shared_ptr<nigel::IM_Command>,_std::allocator<std::shared_ptr<nigel::IM_Command>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       codeBase.imCommands.
       super__List_base<std::shared_ptr<nigel::IM_Command>,_std::allocator<std::shared_ptr<nigel::IM_Command>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  codeBase.imValues._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       codeBase.imValues._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  startTime.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  std::__cxx11::string::string((string *)&notificationList,"c",(allocator *)&e);
  iVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          ::find(&parameters->_M_t,(key_type *)&notificationList);
  p_Var1 = &(parameters->_M_t)._M_impl.super__Rb_tree_header;
  std::__cxx11::string::~string((string *)&notificationList);
  if ((_Rb_tree_header *)iVar4._M_node != p_Var1) {
    std::__cxx11::string::string((string *)&notificationList,"c",&local_151);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::operator[](parameters,(key_type *)&notificationList);
    std::make_shared<boost::filesystem::path,std::__cxx11::string&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e);
    std::__shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2> *)&codeBase,
               (__shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2> *)&e);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&e.super___shared_ptr<nigel::BuilderExecutable,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__cxx11::string::~string((string *)&notificationList);
  }
  std::__cxx11::string::string((string *)&notificationList,"o",(allocator *)&e);
  iVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          ::find(&parameters->_M_t,(key_type *)&notificationList);
  std::__cxx11::string::~string((string *)&notificationList);
  if ((_Rb_tree_header *)iVar4._M_node != p_Var1) {
    std::__cxx11::string::string((string *)&notificationList,"o",&local_151);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::operator[](parameters,(key_type *)&notificationList);
    std::make_shared<boost::filesystem::path,std::__cxx11::string&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e);
    std::__shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&codeBase.destFile.
                super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2> *)&e);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&e.super___shared_ptr<nigel::BuilderExecutable,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__cxx11::string::~string((string *)&notificationList);
  }
  bVar2 = boost::filesystem::operator==
                    (codeBase.srcFile.
                     super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                     codeBase.destFile.
                     super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ;
  if (bVar2) {
    std::__cxx11::string::string((string *)&notificationList,"overwritecode",(allocator *)&e);
    iVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
            ::find(&parameters->_M_t,(key_type *)&notificationList);
    std::__cxx11::string::~string((string *)&notificationList);
    if ((_Rb_tree_header *)iVar4._M_node == p_Var1) {
      __x = (double)std::__cxx11::string::string
                              ((string *)&notificationList,
                               "Warning: you attempt to overwrite your source code! Take --overwritecode as parameter to proceed."
                               ,(allocator *)&e);
      helper::log((helper *)&notificationList,__x);
      std::__cxx11::string::~string((string *)&notificationList);
      EVar3 = parameterError;
      goto LAB_0015ae26;
    }
  }
  std::__cxx11::string::string((string *)&notificationList,"pl",(allocator *)&e);
  iVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          ::find(&parameters->_M_t,(key_type *)&notificationList);
  std::__cxx11::string::~string((string *)&notificationList);
  if ((_Rb_tree_header *)iVar4._M_node != p_Var1) {
    codeBase.printLexer = true;
  }
  std::__cxx11::string::string((string *)&notificationList,"pa",(allocator *)&e);
  iVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          ::find(&parameters->_M_t,(key_type *)&notificationList);
  std::__cxx11::string::~string((string *)&notificationList);
  if ((_Rb_tree_header *)iVar4._M_node != p_Var1) {
    codeBase.printAST = true;
  }
  std::__cxx11::string::string((string *)&notificationList,"pi",(allocator *)&e);
  iVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          ::find(&parameters->_M_t,(key_type *)&notificationList);
  std::__cxx11::string::~string((string *)&notificationList);
  if ((_Rb_tree_header *)iVar4._M_node != p_Var1) {
    codeBase.printIMC = true;
  }
  std::__cxx11::string::string((string *)&notificationList,"pasm",(allocator *)&e);
  iVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          ::find(&parameters->_M_t,(key_type *)&notificationList);
  std::__cxx11::string::~string((string *)&notificationList);
  if ((_Rb_tree_header *)iVar4._M_node != p_Var1) {
    codeBase.printAssembly = true;
  }
  notificationList.
  super__List_base<std::shared_ptr<nigel::CompileNotification>,_std::allocator<std::shared_ptr<nigel::CompileNotification>_>_>
  ._M_impl._M_node._M_size = 0;
  p_Var5 = (_List_node_base *)&this->executables;
  notificationList.
  super__List_base<std::shared_ptr<nigel::CompileNotification>,_std::allocator<std::shared_ptr<nigel::CompileNotification>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&notificationList;
  notificationList.
  super__List_base<std::shared_ptr<nigel::CompileNotification>,_std::allocator<std::shared_ptr<nigel::CompileNotification>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&notificationList;
  do {
    p_Var5 = (((_List_base<std::shared_ptr<nigel::BuilderExecutable>,_std::allocator<std::shared_ptr<nigel::BuilderExecutable>_>_>
                *)&p_Var5->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var5 == (_List_node_base *)&this->executables) {
      EVar3 = success;
      break;
    }
    std::__shared_ptr<nigel::BuilderExecutable,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&e.super___shared_ptr<nigel::BuilderExecutable,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<nigel::BuilderExecutable,_(__gnu_cxx::_Lock_policy)2> *)(p_Var5 + 1));
    EVar3 = (*(e.super___shared_ptr<nigel::BuilderExecutable,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              _vptr_BuilderExecutable[2])
                      (e.super___shared_ptr<nigel::BuilderExecutable,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,&codeBase);
    std::__cxx11::
    list<std::shared_ptr<nigel::CompileNotification>,std::allocator<std::shared_ptr<nigel::CompileNotification>>>
    ::insert<std::_List_const_iterator<std::shared_ptr<nigel::CompileNotification>>,void>
              ((list<std::shared_ptr<nigel::CompileNotification>,std::allocator<std::shared_ptr<nigel::CompileNotification>>>
                *)&notificationList,(const_iterator)&notificationList,
               ((e.super___shared_ptr<nigel::BuilderExecutable,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->notificationList).
               super__List_base<std::shared_ptr<nigel::CompileNotification>,_std::allocator<std::shared_ptr<nigel::CompileNotification>_>_>
               ._M_impl._M_node.super__List_node_base._M_next,
               (_List_const_iterator<std::shared_ptr<nigel::CompileNotification>_>)
               &(e.super___shared_ptr<nigel::BuilderExecutable,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                ->notificationList);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&e.super___shared_ptr<nigel::BuilderExecutable,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  } while (EVar3 == success);
  std::__cxx11::
  list<std::shared_ptr<nigel::CompileNotification>,_std::allocator<std::shared_ptr<nigel::CompileNotification>_>_>
  ::list((list<std::shared_ptr<nigel::CompileNotification>,_std::allocator<std::shared_ptr<nigel::CompileNotification>_>_>
          *)&local_110,&notificationList);
  printErrorLog(this,(list<std::shared_ptr<nigel::CompileNotification>,_std::allocator<std::shared_ptr<nigel::CompileNotification>_>_>
                      *)&local_110,startTime);
  std::__cxx11::
  _List_base<std::shared_ptr<nigel::CompileNotification>,_std::allocator<std::shared_ptr<nigel::CompileNotification>_>_>
  ::_M_clear(&local_110);
  std::__cxx11::
  _List_base<std::shared_ptr<nigel::CompileNotification>,_std::allocator<std::shared_ptr<nigel::CompileNotification>_>_>
  ::_M_clear(&notificationList.
              super__List_base<std::shared_ptr<nigel::CompileNotification>,_std::allocator<std::shared_ptr<nigel::CompileNotification>_>_>
            );
LAB_0015ae26:
  CodeBase::~CodeBase(&codeBase);
  return EVar3;
}

Assistant:

ExecutionResult BuilderTask::execute( std::map<String, std::list<String>> parameters, std::set<char> flags )
	{
		CodeBase codeBase;
		auto startTime = std::chrono::system_clock::now();

		if( parameters.find( "c" ) != parameters.end() ) codeBase.srcFile = std::make_shared<fs::path>( parameters["c"].front() );
		if( parameters.find( "o" ) != parameters.end() ) codeBase.destFile = std::make_shared<fs::path>( parameters["o"].front() );
		if( *codeBase.srcFile == *codeBase.destFile && parameters.find( "overwritecode" ) == parameters.end() )
		{
			log( "Warning: you attempt to overwrite your source code! Take --overwritecode as parameter to proceed.", LogLevel::Warning );
			return ExecutionResult::parameterError;
		}

		if( parameters.find( "pl" ) != parameters.end() ) codeBase.printLexer = true;
		if( parameters.find( "pa" ) != parameters.end() ) codeBase.printAST = true;
		if( parameters.find( "pi" ) != parameters.end() ) codeBase.printIMC = true;
		if( parameters.find( "pasm" ) != parameters.end() ) codeBase.printAssembly = true;

		std::list<std::shared_ptr<CompileNotification>> notificationList;
		ExecutionResult executionResult = ExecutionResult::success;

		for( auto e : executables )
		{
			ExecutionResult result = e->onExecute( codeBase );
			notificationList.insert( notificationList.end(), e->getNotifications().begin(), e->getNotifications().end() );
			if( result != ExecutionResult::success )
			{
				executionResult = result;
				break;
			}
		}

		printErrorLog( notificationList, startTime );
		return executionResult;
	}